

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O1

REF_STATUS ref_meshlink_tri_norm_deviation(REF_GRID ref_grid,REF_INT *nodes,REF_DBL *dot_product)

{
  *dot_product = -2.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_tri_norm_deviation(REF_GRID ref_grid,
                                                   REF_INT *nodes,
                                                   REF_DBL *dot_product) {
#ifdef HAVE_MESHLINK
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  MeshAssociativityObj mesh_assoc;
  GeometryKernelObj geom_kernel = NULL;
  ProjectionDataObj projection_data = NULL;
  GeometryGroupObj geom_group = NULL;
  MLVector3D center_point;
  MLVector3D normal;
  REF_INT i, id;
  REF_BOOL supported;
  MLINT gref;
  REF_STATUS status;
  REF_DBL tri_normal[3];
  REF_DBL area_sign = 1.0;
  MLVector3D projected_point;
  MLVector2D uv;
  char entity_name[REF_MESHLINK_MAX_STRING_SIZE];
  MLVector3D eval_point;
  MLVector3D dXYZdU;    /* First partial derivative */
  MLVector3D dXYZdV;    /* First partial derivative */
  MLVector3D d2XYZdU2;  /* Second partial derivative */
  MLVector3D d2XYZdUdV; /* Second partial derivative */
  MLVector3D d2XYZdV2;  /* Second partial derivative */
  MLVector3D principalV;
  MLREAL minCurvature;
  MLREAL maxCurvature;
  MLREAL avg;
  MLREAL gauss;
  MLORIENT orientation;
  MLREAL distance;
  MLREAL tolerance;

  *dot_product = -2.0;

  RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
  if (!supported) { /* no geom support */
    *dot_product = 1.0;
    return REF_SUCCESS;
  }

  RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, tri_normal),
      "tri normal");
  /* collapse attempts could create zero area, reject the step with -2.0 */
  status = ref_math_normalize(tri_normal);
  if (REF_DIV_ZERO == status) {
    *dot_product = -4.0;
    return REF_SUCCESS;
  }
  RSS(status, "normalize");

  RNS(ref_geom->uv_area_sign, "uv_area_sign NULL");
  RNS(ref_geom->meshlink, "meshlink NULL");
  mesh_assoc = (MeshAssociativityObj)(ref_geom->meshlink);
  projection_data = (ProjectionDataObj)(ref_geom->meshlink_projection);

  for (i = 0; i < 3; i++) {
    center_point[i] = (1.0 / 3.0) * (ref_node_xyz(ref_node, i, nodes[0]) +
                                     ref_node_xyz(ref_node, i, nodes[1]) +
                                     ref_node_xyz(ref_node, i, nodes[2]));
  }
  id = nodes[3];
  gref = (MLINT)(id);

  REIS(0, ML_getActiveGeometryKernel(mesh_assoc, &geom_kernel), "kern");
  REIS(0, ML_getGeometryGroupByID(mesh_assoc, gref, &geom_group), "grp");

  if (0 !=
      ML_projectPoint(geom_kernel, geom_group, center_point, projection_data)) {
    REF_WHERE("ML_projectPoint face failed, assumes flat")
    printf("normdev failid %d xyz %f %f %f\n", (REF_INT)gref, center_point[0],
           center_point[1], center_point[2]);
    *dot_product = -3.0;
    return REF_SUCCESS;
  }
  REIS(0,
       ML_getProjectionInfo(geom_kernel, projection_data, projected_point, uv,
                            entity_name, REF_MESHLINK_MAX_STRING_SIZE,
                            &distance, &tolerance),
       "info");
  REIS(0,
       ML_evalCurvatureOnSurface(geom_kernel, uv, entity_name, eval_point,
                                 dXYZdU, dXYZdV, d2XYZdU2, d2XYZdUdV, d2XYZdV2,
                                 normal, principalV, &minCurvature,
                                 &maxCurvature, &avg, &gauss, &orientation),
       "eval");

  area_sign = 1.0;
  if (ML_ORIENT_SAME == orientation) area_sign = -1.0;
  area_sign *= ref_geom->uv_area_sign[id - 1];

  *dot_product = area_sign * ref_math_dot(normal, tri_normal);

#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_grid);
  SUPRESS_UNUSED_COMPILER_WARNING(nodes);
  *dot_product = -2.0;
#endif
  return REF_SUCCESS;
}